

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_int128_impl.h
# Opt level: O0

void secp256k1_fe_mul_inner(uint64_t *r,uint64_t *a,uint64_t *b)

{
  uint64_t a_00;
  uint64_t a_01;
  uint64_t a_02;
  uint64_t a_03;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t R;
  uint64_t M;
  uint64_t a4;
  uint64_t a3;
  uint64_t a2;
  uint64_t a1;
  uint64_t a0;
  uint64_t u0;
  uint64_t tx;
  uint64_t t4;
  uint64_t t3;
  secp256k1_uint128 d;
  secp256k1_uint128 c;
  uint in_stack_ffffffffffffff6c;
  secp256k1_uint128 *r_00;
  secp256k1_uint128 local_38;
  secp256k1_uint128 local_28;
  uint64_t *local_18;
  uint64_t *local_8;
  
  uVar5 = *in_RSI;
  a_00 = in_RSI[1];
  a_01 = in_RSI[2];
  a_02 = in_RSI[3];
  a_03 = in_RSI[4];
  r_00 = (secp256k1_uint128 *)0x1000003d10;
  if (*in_RSI >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x18,"test condition failed: ((a[0]) >> (56)) == 0");
    abort();
  }
  if (in_RSI[1] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x19,"test condition failed: ((a[1]) >> (56)) == 0");
    abort();
  }
  if (in_RSI[2] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1a,"test condition failed: ((a[2]) >> (56)) == 0");
    abort();
  }
  if (in_RSI[3] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1b,"test condition failed: ((a[3]) >> (56)) == 0");
    abort();
  }
  if (in_RSI[4] >> 0x34 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1c,"test condition failed: ((a[4]) >> (52)) == 0");
    abort();
  }
  if (*in_RDX >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1d,"test condition failed: ((b[0]) >> (56)) == 0");
    abort();
  }
  if (in_RDX[1] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1e,"test condition failed: ((b[1]) >> (56)) == 0");
    abort();
  }
  if (in_RDX[2] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x1f,"test condition failed: ((b[2]) >> (56)) == 0");
    abort();
  }
  if (in_RDX[3] >> 0x38 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x20,"test condition failed: ((b[3]) >> (56)) == 0");
    abort();
  }
  if (in_RDX[4] >> 0x34 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x21,"test condition failed: ((b[4]) >> (52)) == 0");
    abort();
  }
  if (in_RDI == in_RDX) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x22,"test condition failed: r != b");
    abort();
  }
  if (in_RSI == in_RDX) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x23,"test condition failed: a != b");
    abort();
  }
  local_18 = in_RDX;
  local_8 = in_RDI;
  secp256k1_u128_mul(&local_38,uVar5,in_RDX[3]);
  secp256k1_u128_accum_mul(&local_38,a_00,local_18[2]);
  secp256k1_u128_accum_mul(&local_38,a_01,local_18[1]);
  secp256k1_u128_accum_mul(&local_38,a_02,*local_18);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x2f,"test condition failed: secp256k1_u128_check_bits((&d), (114))");
    abort();
  }
  secp256k1_u128_mul(&local_28,a_03,local_18[4]);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x32,"test condition failed: secp256k1_u128_check_bits((&c), (112))");
    abort();
  }
  uVar2 = secp256k1_u128_to_u64(&local_28);
  secp256k1_u128_accum_mul(&local_38,0x1000003d10,uVar2);
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x35,"test condition failed: secp256k1_u128_check_bits((&d), (115))");
    abort();
  }
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x36,"test condition failed: secp256k1_u128_check_bits((&c), (48))");
    abort();
  }
  uVar2 = secp256k1_u128_to_u64(&local_38);
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x3a,"test condition failed: secp256k1_u128_check_bits((&d), (63))");
    abort();
  }
  secp256k1_u128_accum_mul(&local_38,uVar5,local_18[4]);
  secp256k1_u128_accum_mul(&local_38,a_00,local_18[3]);
  secp256k1_u128_accum_mul(&local_38,a_01,local_18[2]);
  secp256k1_u128_accum_mul(&local_38,a_02,local_18[1]);
  secp256k1_u128_accum_mul(&local_38,a_03,*local_18);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x42,"test condition failed: secp256k1_u128_check_bits((&d), (115))");
    abort();
  }
  uVar3 = secp256k1_u128_to_u64(&local_28);
  secp256k1_u128_accum_mul(&local_38,0x1000003d10000,uVar3);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x45,"test condition failed: secp256k1_u128_check_bits((&d), (116))");
    abort();
  }
  uVar3 = secp256k1_u128_to_u64(&local_38);
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x49,"test condition failed: secp256k1_u128_check_bits((&d), (64))");
    abort();
  }
  secp256k1_u128_mul(&local_28,uVar5,*local_18);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x51,"test condition failed: secp256k1_u128_check_bits((&c), (112))");
    abort();
  }
  secp256k1_u128_accum_mul(&local_38,a_00,local_18[4]);
  secp256k1_u128_accum_mul(&local_38,a_01,local_18[3]);
  secp256k1_u128_accum_mul(&local_38,a_02,local_18[2]);
  secp256k1_u128_accum_mul(&local_38,a_03,local_18[1]);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x57,"test condition failed: secp256k1_u128_check_bits((&d), (114))");
    abort();
  }
  uVar4 = secp256k1_u128_to_u64(&local_38);
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x5b,"test condition failed: secp256k1_u128_check_bits((&d), (62))");
    abort();
  }
  secp256k1_u128_accum_mul
            (&local_28,(uVar4 & 0xfffffffffffff) << 4 | (uVar3 & 0xfffffffffffff) >> 0x30,
             0x1000003d1);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x62,"test condition failed: secp256k1_u128_check_bits((&c), (113))");
    abort();
  }
  uVar4 = secp256k1_u128_to_u64(&local_28);
  *local_8 = uVar4 & 0xfffffffffffff;
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  if (*local_8 >> 0x34 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x65,"test condition failed: ((r[0]) >> (52)) == 0");
    abort();
  }
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x66,"test condition failed: secp256k1_u128_check_bits((&c), (61))");
    abort();
  }
  secp256k1_u128_accum_mul(&local_28,uVar5,local_18[1]);
  secp256k1_u128_accum_mul(&local_28,a_00,*local_18);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x6b,"test condition failed: secp256k1_u128_check_bits((&c), (114))");
    abort();
  }
  secp256k1_u128_accum_mul(&local_38,a_01,local_18[4]);
  secp256k1_u128_accum_mul(&local_38,a_02,local_18[3]);
  secp256k1_u128_accum_mul(&local_38,a_03,local_18[2]);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x70,"test condition failed: secp256k1_u128_check_bits((&d), (114))");
    abort();
  }
  uVar4 = secp256k1_u128_to_u64(&local_38);
  secp256k1_u128_accum_mul(&local_28,uVar4 & 0xfffffffffffff,0x1000003d10);
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x73,"test condition failed: secp256k1_u128_check_bits((&c), (115))");
    abort();
  }
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x74,"test condition failed: secp256k1_u128_check_bits((&d), (62))");
    abort();
  }
  uVar4 = secp256k1_u128_to_u64(&local_28);
  local_8[1] = uVar4 & 0xfffffffffffff;
  secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
  if (local_8[1] >> 0x34 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x77,"test condition failed: ((r[1]) >> (52)) == 0");
    abort();
  }
  iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
  if (iVar1 != 0) {
    secp256k1_u128_accum_mul(&local_28,uVar5,local_18[2]);
    secp256k1_u128_accum_mul(&local_28,a_00,local_18[1]);
    secp256k1_u128_accum_mul(&local_28,a_01,*local_18);
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x7e,"test condition failed: secp256k1_u128_check_bits((&c), (114))");
      abort();
    }
    secp256k1_u128_accum_mul(&local_38,a_02,local_18[4]);
    secp256k1_u128_accum_mul(&local_38,a_03,local_18[3]);
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x82,"test condition failed: secp256k1_u128_check_bits((&d), (114))");
      abort();
    }
    uVar5 = secp256k1_u128_to_u64(&local_38);
    secp256k1_u128_accum_mul(&local_28,0x1000003d10,uVar5);
    secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x85,"test condition failed: secp256k1_u128_check_bits((&c), (115))");
      abort();
    }
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x86,"test condition failed: secp256k1_u128_check_bits((&d), (50))");
      abort();
    }
    uVar5 = secp256k1_u128_to_u64(&local_28);
    local_8[2] = uVar5 & 0xfffffffffffff;
    secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
    if (local_8[2] >> 0x34 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x8a,"test condition failed: ((r[2]) >> (52)) == 0");
      abort();
    }
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x8b,"test condition failed: secp256k1_u128_check_bits((&c), (63))");
      abort();
    }
    uVar5 = secp256k1_u128_to_u64(&local_38);
    secp256k1_u128_accum_mul(&local_28,0x1000003d10000,uVar5);
    secp256k1_u128_accum_u64(&local_28,uVar2 & 0xfffffffffffff);
    iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
              ,0x8f,"test condition failed: secp256k1_u128_check_bits((&c), (100))");
      abort();
    }
    uVar5 = secp256k1_u128_to_u64(&local_28);
    local_8[3] = uVar5 & 0xfffffffffffff;
    secp256k1_u128_rshift(r_00,in_stack_ffffffffffffff6c);
    if (local_8[3] >> 0x34 == 0) {
      iVar1 = secp256k1_u128_check_bits(r_00,in_stack_ffffffffffffff6c);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
                ,0x93,"test condition failed: secp256k1_u128_check_bits((&c), (48))");
        abort();
      }
      uVar5 = secp256k1_u128_to_u64(&local_28);
      local_8[4] = uVar5 + (uVar3 & 0xffffffffffff);
      if (local_8[4] >> 0x31 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
                ,0x96,"test condition failed: ((r[4]) >> (49)) == 0");
        abort();
      }
      return;
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
            ,0x92,"test condition failed: ((r[3]) >> (52)) == 0");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_int128_impl.h"
          ,0x78,"test condition failed: secp256k1_u128_check_bits((&c), (63))");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_inner(uint64_t *r, const uint64_t *a, const uint64_t * SECP256K1_RESTRICT b) {
    secp256k1_uint128 c, d;
    uint64_t t3, t4, tx, u0;
    uint64_t a0 = a[0], a1 = a[1], a2 = a[2], a3 = a[3], a4 = a[4];
    const uint64_t M = 0xFFFFFFFFFFFFFULL, R = 0x1000003D10ULL;

    VERIFY_BITS(a[0], 56);
    VERIFY_BITS(a[1], 56);
    VERIFY_BITS(a[2], 56);
    VERIFY_BITS(a[3], 56);
    VERIFY_BITS(a[4], 52);
    VERIFY_BITS(b[0], 56);
    VERIFY_BITS(b[1], 56);
    VERIFY_BITS(b[2], 56);
    VERIFY_BITS(b[3], 56);
    VERIFY_BITS(b[4], 52);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    /*  [... a b c] is a shorthand for ... + a<<104 + b<<52 + c<<0 mod n.
     *  for 0 <= x <= 4, px is a shorthand for sum(a[i]*b[x-i], i=0..x).
     *  for 4 <= x <= 8, px is a shorthand for sum(a[i]*b[x-i], i=(x-4)..4)
     *  Note that [x 0 0 0 0 0] = [x*R].
     */

    secp256k1_u128_mul(&d, a0, b[3]);
    secp256k1_u128_accum_mul(&d, a1, b[2]);
    secp256k1_u128_accum_mul(&d, a2, b[1]);
    secp256k1_u128_accum_mul(&d, a3, b[0]);
    VERIFY_BITS_128(&d, 114);
    /* [d 0 0 0] = [p3 0 0 0] */
    secp256k1_u128_mul(&c, a4, b[4]);
    VERIFY_BITS_128(&c, 112);
    /* [c 0 0 0 0 d 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */
    secp256k1_u128_accum_mul(&d, R, secp256k1_u128_to_u64(&c)); secp256k1_u128_rshift(&c, 64);
    VERIFY_BITS_128(&d, 115);
    VERIFY_BITS_128(&c, 48);
    /* [(c<<12) 0 0 0 0 0 d 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */
    t3 = secp256k1_u128_to_u64(&d) & M; secp256k1_u128_rshift(&d, 52);
    VERIFY_BITS(t3, 52);
    VERIFY_BITS_128(&d, 63);
    /* [(c<<12) 0 0 0 0 d t3 0 0 0] = [p8 0 0 0 0 p3 0 0 0] */

    secp256k1_u128_accum_mul(&d, a0, b[4]);
    secp256k1_u128_accum_mul(&d, a1, b[3]);
    secp256k1_u128_accum_mul(&d, a2, b[2]);
    secp256k1_u128_accum_mul(&d, a3, b[1]);
    secp256k1_u128_accum_mul(&d, a4, b[0]);
    VERIFY_BITS_128(&d, 115);
    /* [(c<<12) 0 0 0 0 d t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    secp256k1_u128_accum_mul(&d, R << 12, secp256k1_u128_to_u64(&c));
    VERIFY_BITS_128(&d, 116);
    /* [d t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    t4 = secp256k1_u128_to_u64(&d) & M; secp256k1_u128_rshift(&d, 52);
    VERIFY_BITS(t4, 52);
    VERIFY_BITS_128(&d, 64);
    /* [d t4 t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */
    tx = (t4 >> 48); t4 &= (M >> 4);
    VERIFY_BITS(tx, 4);
    VERIFY_BITS(t4, 48);
    /* [d t4+(tx<<48) t3 0 0 0] = [p8 0 0 0 p4 p3 0 0 0] */

    secp256k1_u128_mul(&c, a0, b[0]);
    VERIFY_BITS_128(&c, 112);
    /* [d t4+(tx<<48) t3 0 0 c] = [p8 0 0 0 p4 p3 0 0 p0] */
    secp256k1_u128_accum_mul(&d, a1, b[4]);
    secp256k1_u128_accum_mul(&d, a2, b[3]);
    secp256k1_u128_accum_mul(&d, a3, b[2]);
    secp256k1_u128_accum_mul(&d, a4, b[1]);
    VERIFY_BITS_128(&d, 114);
    /* [d t4+(tx<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    u0 = secp256k1_u128_to_u64(&d) & M; secp256k1_u128_rshift(&d, 52);
    VERIFY_BITS(u0, 52);
    VERIFY_BITS_128(&d, 62);
    /* [d u0 t4+(tx<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    /* [d 0 t4+(tx<<48)+(u0<<52) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    u0 = (u0 << 4) | tx;
    VERIFY_BITS(u0, 56);
    /* [d 0 t4+(u0<<48) t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    secp256k1_u128_accum_mul(&c, u0, R >> 4);
    VERIFY_BITS_128(&c, 113);
    /* [d 0 t4 t3 0 0 c] = [p8 0 0 p5 p4 p3 0 0 p0] */
    r[0] = secp256k1_u128_to_u64(&c) & M; secp256k1_u128_rshift(&c, 52);
    VERIFY_BITS(r[0], 52);
    VERIFY_BITS_128(&c, 61);
    /* [d 0 t4 t3 0 c r0] = [p8 0 0 p5 p4 p3 0 0 p0] */

    secp256k1_u128_accum_mul(&c, a0, b[1]);
    secp256k1_u128_accum_mul(&c, a1, b[0]);
    VERIFY_BITS_128(&c, 114);
    /* [d 0 t4 t3 0 c r0] = [p8 0 0 p5 p4 p3 0 p1 p0] */
    secp256k1_u128_accum_mul(&d, a2, b[4]);
    secp256k1_u128_accum_mul(&d, a3, b[3]);
    secp256k1_u128_accum_mul(&d, a4, b[2]);
    VERIFY_BITS_128(&d, 114);
    /* [d 0 t4 t3 0 c r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */
    secp256k1_u128_accum_mul(&c, secp256k1_u128_to_u64(&d) & M, R); secp256k1_u128_rshift(&d, 52);
    VERIFY_BITS_128(&c, 115);
    VERIFY_BITS_128(&d, 62);
    /* [d 0 0 t4 t3 0 c r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */
    r[1] = secp256k1_u128_to_u64(&c) & M; secp256k1_u128_rshift(&c, 52);
    VERIFY_BITS(r[1], 52);
    VERIFY_BITS_128(&c, 63);
    /* [d 0 0 t4 t3 c r1 r0] = [p8 0 p6 p5 p4 p3 0 p1 p0] */

    secp256k1_u128_accum_mul(&c, a0, b[2]);
    secp256k1_u128_accum_mul(&c, a1, b[1]);
    secp256k1_u128_accum_mul(&c, a2, b[0]);
    VERIFY_BITS_128(&c, 114);
    /* [d 0 0 t4 t3 c r1 r0] = [p8 0 p6 p5 p4 p3 p2 p1 p0] */
    secp256k1_u128_accum_mul(&d, a3, b[4]);
    secp256k1_u128_accum_mul(&d, a4, b[3]);
    VERIFY_BITS_128(&d, 114);
    /* [d 0 0 t4 t3 c t1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    secp256k1_u128_accum_mul(&c, R, secp256k1_u128_to_u64(&d)); secp256k1_u128_rshift(&d, 64);
    VERIFY_BITS_128(&c, 115);
    VERIFY_BITS_128(&d, 50);
    /* [(d<<12) 0 0 0 t4 t3 c r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */

    r[2] = secp256k1_u128_to_u64(&c) & M; secp256k1_u128_rshift(&c, 52);
    VERIFY_BITS(r[2], 52);
    VERIFY_BITS_128(&c, 63);
    /* [(d<<12) 0 0 0 t4 t3+c r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    secp256k1_u128_accum_mul(&c, R << 12, secp256k1_u128_to_u64(&d));
    secp256k1_u128_accum_u64(&c, t3);
    VERIFY_BITS_128(&c, 100);
    /* [t4 c r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    r[3] = secp256k1_u128_to_u64(&c) & M; secp256k1_u128_rshift(&c, 52);
    VERIFY_BITS(r[3], 52);
    VERIFY_BITS_128(&c, 48);
    /* [t4+c r3 r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
    r[4] = secp256k1_u128_to_u64(&c) + t4;
    VERIFY_BITS(r[4], 49);
    /* [r4 r3 r2 r1 r0] = [p8 p7 p6 p5 p4 p3 p2 p1 p0] */
}